

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

char * __thiscall tinyxml2::XMLDocument::Identify(XMLDocument *this,char *p,XMLNode **node)

{
  bool bVar1;
  char *p_00;
  XMLNode *pXVar2;
  undefined **ppuVar3;
  
  p_00 = XMLUtil::SkipWhiteSpace(p);
  if (*p_00 == '\0') {
    pXVar2 = (XMLNode *)0x0;
    goto LAB_001bda44;
  }
  bVar1 = XMLUtil::StringEqual(p_00,"<?",2);
  if (bVar1) {
    pXVar2 = (XMLNode *)MemPoolT<88>::Alloc(&this->_commentPool);
    pXVar2->_document = this;
    pXVar2->_parent = (XMLNode *)0x0;
    (pXVar2->_value)._flags = 0;
    (pXVar2->_value)._start = (char *)0x0;
    (pXVar2->_value)._end = (char *)0x0;
    pXVar2->_firstChild = (XMLNode *)0x0;
    pXVar2->_lastChild = (XMLNode *)0x0;
    pXVar2->_prev = (XMLNode *)0x0;
    pXVar2->_next = (XMLNode *)0x0;
    ppuVar3 = &PTR_ToElement_002816a0;
  }
  else {
    bVar1 = XMLUtil::StringEqual(p_00,"<!--",4);
    if (bVar1) {
      pXVar2 = (XMLNode *)MemPoolT<88>::Alloc(&this->_commentPool);
      pXVar2->_document = this;
      pXVar2->_parent = (XMLNode *)0x0;
      (pXVar2->_value)._flags = 0;
      (pXVar2->_value)._start = (char *)0x0;
      (pXVar2->_value)._end = (char *)0x0;
      pXVar2->_firstChild = (XMLNode *)0x0;
      pXVar2->_lastChild = (XMLNode *)0x0;
      pXVar2->_prev = (XMLNode *)0x0;
      pXVar2->_next = (XMLNode *)0x0;
      pXVar2->_vptr_XMLNode = (_func_int **)&PTR_ToElement_00281600;
      pXVar2->_memPool = &(this->_commentPool).super_MemPool;
      p_00 = p_00 + 4;
      goto LAB_001bda44;
    }
    bVar1 = XMLUtil::StringEqual(p_00,"<![CDATA[",9);
    if (bVar1) {
      pXVar2 = (XMLNode *)MemPoolT<96>::Alloc(&this->_textPool);
      pXVar2->_document = this;
      pXVar2->_parent = (XMLNode *)0x0;
      (pXVar2->_value)._flags = 0;
      (pXVar2->_value)._start = (char *)0x0;
      (pXVar2->_value)._end = (char *)0x0;
      pXVar2->_firstChild = (XMLNode *)0x0;
      pXVar2->_lastChild = (XMLNode *)0x0;
      pXVar2->_prev = (XMLNode *)0x0;
      pXVar2->_next = (XMLNode *)0x0;
      pXVar2->_vptr_XMLNode = (_func_int **)&PTR_ToElement_00281998;
      pXVar2->_memPool = &(this->_textPool).super_MemPool;
      *(undefined1 *)&pXVar2[1]._vptr_XMLNode = 1;
      p_00 = p_00 + 9;
      goto LAB_001bda44;
    }
    bVar1 = XMLUtil::StringEqual(p_00,"<!",2);
    if (!bVar1) {
      bVar1 = XMLUtil::StringEqual(p_00,"<",1);
      if (bVar1) {
        pXVar2 = (XMLNode *)MemPoolT<104>::Alloc(&this->_elementPool);
        pXVar2->_document = this;
        pXVar2->_parent = (XMLNode *)0x0;
        (pXVar2->_value)._flags = 0;
        (pXVar2->_value)._start = (char *)0x0;
        (pXVar2->_value)._end = (char *)0x0;
        pXVar2->_firstChild = (XMLNode *)0x0;
        pXVar2->_lastChild = (XMLNode *)0x0;
        pXVar2->_prev = (XMLNode *)0x0;
        pXVar2->_next = (XMLNode *)0x0;
        pXVar2->_vptr_XMLNode = (_func_int **)&PTR_ToElement_002817e0;
        *(undefined4 *)&pXVar2[1]._vptr_XMLNode = 0;
        pXVar2[1]._document = (XMLDocument *)0x0;
        pXVar2->_memPool = &(this->_elementPool).super_MemPool;
        p_00 = p_00 + 1;
      }
      else {
        pXVar2 = (XMLNode *)MemPoolT<96>::Alloc(&this->_textPool);
        pXVar2->_document = this;
        pXVar2->_parent = (XMLNode *)0x0;
        (pXVar2->_value)._flags = 0;
        (pXVar2->_value)._start = (char *)0x0;
        (pXVar2->_value)._end = (char *)0x0;
        pXVar2->_firstChild = (XMLNode *)0x0;
        pXVar2->_lastChild = (XMLNode *)0x0;
        pXVar2->_prev = (XMLNode *)0x0;
        pXVar2->_next = (XMLNode *)0x0;
        pXVar2->_vptr_XMLNode = (_func_int **)&PTR_ToElement_00281998;
        *(undefined1 *)&pXVar2[1]._vptr_XMLNode = 0;
        pXVar2->_memPool = &(this->_textPool).super_MemPool;
        p_00 = p;
      }
      goto LAB_001bda44;
    }
    pXVar2 = (XMLNode *)MemPoolT<88>::Alloc(&this->_commentPool);
    pXVar2->_document = this;
    pXVar2->_parent = (XMLNode *)0x0;
    (pXVar2->_value)._flags = 0;
    (pXVar2->_value)._start = (char *)0x0;
    (pXVar2->_value)._end = (char *)0x0;
    pXVar2->_firstChild = (XMLNode *)0x0;
    pXVar2->_lastChild = (XMLNode *)0x0;
    pXVar2->_prev = (XMLNode *)0x0;
    pXVar2->_next = (XMLNode *)0x0;
    ppuVar3 = &PTR_ToElement_00281740;
  }
  pXVar2->_vptr_XMLNode = (_func_int **)ppuVar3;
  pXVar2->_memPool = &(this->_commentPool).super_MemPool;
  p_00 = p_00 + 2;
LAB_001bda44:
  *node = pXVar2;
  return p_00;
}

Assistant:

char* XMLDocument::Identify( char* p, XMLNode** node )
{
    TIXMLASSERT( node );
    TIXMLASSERT( p );
    char* const start = p;
    p = XMLUtil::SkipWhiteSpace( p );
    if( !*p ) {
        *node = 0;
        TIXMLASSERT( p );
        return p;
    }

    // These strings define the matching patterns:
    static const char* xmlHeader		= { "<?" };
    static const char* commentHeader	= { "<!--" };
    static const char* cdataHeader		= { "<![CDATA[" };
    static const char* dtdHeader		= { "<!" };
    static const char* elementHeader	= { "<" };	// and a header for everything else; check last.

    static const int xmlHeaderLen		= 2;
    static const int commentHeaderLen	= 4;
    static const int cdataHeaderLen		= 9;
    static const int dtdHeaderLen		= 2;
    static const int elementHeaderLen	= 1;

    TIXMLASSERT( sizeof( XMLComment ) == sizeof( XMLUnknown ) );		// use same memory pool
    TIXMLASSERT( sizeof( XMLComment ) == sizeof( XMLDeclaration ) );	// use same memory pool
    XMLNode* returnNode = 0;
    if ( XMLUtil::StringEqual( p, xmlHeader, xmlHeaderLen ) ) {
        TIXMLASSERT( sizeof( XMLDeclaration ) == _commentPool.ItemSize() );
        returnNode = new (_commentPool.Alloc()) XMLDeclaration( this );
        returnNode->_memPool = &_commentPool;
        p += xmlHeaderLen;
    }
    else if ( XMLUtil::StringEqual( p, commentHeader, commentHeaderLen ) ) {
        TIXMLASSERT( sizeof( XMLComment ) == _commentPool.ItemSize() );
        returnNode = new (_commentPool.Alloc()) XMLComment( this );
        returnNode->_memPool = &_commentPool;
        p += commentHeaderLen;
    }
    else if ( XMLUtil::StringEqual( p, cdataHeader, cdataHeaderLen ) ) {
        TIXMLASSERT( sizeof( XMLText ) == _textPool.ItemSize() );
        XMLText* text = new (_textPool.Alloc()) XMLText( this );
        returnNode = text;
        returnNode->_memPool = &_textPool;
        p += cdataHeaderLen;
        text->SetCData( true );
    }
    else if ( XMLUtil::StringEqual( p, dtdHeader, dtdHeaderLen ) ) {
        TIXMLASSERT( sizeof( XMLUnknown ) == _commentPool.ItemSize() );
        returnNode = new (_commentPool.Alloc()) XMLUnknown( this );
        returnNode->_memPool = &_commentPool;
        p += dtdHeaderLen;
    }
    else if ( XMLUtil::StringEqual( p, elementHeader, elementHeaderLen ) ) {
        TIXMLASSERT( sizeof( XMLElement ) == _elementPool.ItemSize() );
        returnNode = new (_elementPool.Alloc()) XMLElement( this );
        returnNode->_memPool = &_elementPool;
        p += elementHeaderLen;
    }
    else {
        TIXMLASSERT( sizeof( XMLText ) == _textPool.ItemSize() );
        returnNode = new (_textPool.Alloc()) XMLText( this );
        returnNode->_memPool = &_textPool;
        p = start;	// Back it up, all the text counts.
    }

    TIXMLASSERT( returnNode );
    TIXMLASSERT( p );
    *node = returnNode;
    return p;
}